

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_shrinkToFit(AString *str)

{
  char *pcVar1;
  ulong local_30;
  char *tmpBuffer;
  size_t newCapacity;
  AString *str_local;
  
  if (str != (AString *)0x0) {
    if (str->size < 8) {
      local_30 = 8;
    }
    else {
      local_30 = str->size;
    }
    if (str->capacity <= local_30) {
      return true;
    }
    pcVar1 = (char *)(*str->reallocator)(str->buffer,local_30 + 1);
    if (pcVar1 != (char *)0x0) {
      str->capacity = local_30;
      str->buffer = pcVar1;
      return true;
    }
  }
  return false;
}

Assistant:

ACUTILS_HD_FUNC bool AString_shrinkToFit(struct AString *str)
{
    if(str != nullptr) {
        size_t newCapacity = (str->size < private_ACUtils_AString_capacityMin) ? private_ACUtils_AString_capacityMin : str->size;
        if(newCapacity < str->capacity) {
            char *tmpBuffer = (char *) str->reallocator(str->buffer, (newCapacity + 1) * sizeof(char));
            if(tmpBuffer != nullptr) {
                str->capacity = newCapacity;
                str->buffer = tmpBuffer;
                return true;
            }
        } else {
            return true;
        }
    }
    return false;
}